

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall
CTcPrsOpOr::eval_constant(CTcPrsOpOr *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CTcPrsNode *pCVar3;
  
  pCVar3 = left;
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pCVar3 = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
    iVar1 = CTcConstVal::get_val_bool((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
    if (iVar1 != 0) {
      right = left;
    }
    iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
    if (CONCAT44(extraout_var_01,iVar1) == 0) {
      pCVar3 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)pCVar3);
      pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)right;
      (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00350fe8;
    }
    else {
      iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
      iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
      iVar2 = CTcConstVal::get_val_bool((CTcConstVal *)CONCAT44(extraout_var_03,iVar2));
      *(uint *)CONCAT44(extraout_var_02,iVar1) = 2 - (uint)(iVar2 == 0);
      pCVar3 = right;
    }
  }
  return pCVar3;
}

Assistant:

CTcPrsNode *CTcPrsOpOr::eval_constant(CTcPrsNode *left,
                                      CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const())
    {
        CTcPrsNode *ret;
        
        /* 
         *   Check for constants.  If the first expression is constant,
         *   the result will always be either 'true' (if the first
         *   expression's constant value is true), or the value of the
         *   second expression (if the first expression's constant value
         *   is 'nil').
         *   
         *   Note that it doesn't matter whether or not the right side is
         *   a constant.  If the left is true, the right will never be
         *   executed because of the short-circuit logic; if the left is
         *   nil, the result will always be the result of the right value.
         */
        if (left->get_const_val()->get_val_bool())
        {
            /* 
             *   the left is true, so the result is always true, and the
             *   right never gets executed 
             */
            ret = left;
        }
        else
        {
            /* the left is nil, so the result is the right value */
            ret = right;
        }

        /* ensure the result is a boolean value */
        if (ret->is_const())
        {
            /* make it a true/nil constant value */
            ret->get_const_val()
                ->set_bool(ret->get_const_val()->get_val_bool());
        }
        else
        {
            /* boolean-ize the value at run-time as needed */
            ret = new CTPNBoolize(ret);
        }

        /* return the result */
        return ret;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}